

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int IncreaseTransparency(WebPPicture *src,FrameRectangle *rect,WebPPicture *dst)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  int iVar4;
  uint32_t *pdst;
  uint32_t *psrc;
  int modified;
  int j;
  int i;
  WebPPicture *dst_local;
  FrameRectangle *rect_local;
  WebPPicture *src_local;
  
  modified = 0;
  for (j = rect->y_offset; j < rect->y_offset + rect->height; j = j + 1) {
    puVar2 = src->argb;
    iVar1 = src->argb_stride;
    puVar3 = dst->argb;
    iVar4 = j * dst->argb_stride;
    for (i = rect->x_offset; i < rect->x_offset + rect->width; i = i + 1) {
      if ((puVar2[(long)(j * iVar1) + (long)i] == puVar3[(long)iVar4 + (long)i]) &&
         (puVar3[(long)iVar4 + (long)i] != 0)) {
        puVar3[(long)iVar4 + (long)i] = 0;
        modified = 1;
      }
    }
  }
  return modified;
}

Assistant:

static int IncreaseTransparency(const WebPPicture* const src,
                                const FrameRectangle* const rect,
                                WebPPicture* const dst) {
  int i, j;
  int modified = 0;
  assert(src != NULL && dst != NULL && rect != NULL);
  assert(src->width == dst->width && src->height == dst->height);
  for (j = rect->y_offset; j < rect->y_offset + rect->height; ++j) {
    const uint32_t* const psrc = src->argb + j * src->argb_stride;
    uint32_t* const pdst = dst->argb + j * dst->argb_stride;
    for (i = rect->x_offset; i < rect->x_offset + rect->width; ++i) {
      if (psrc[i] == pdst[i] && pdst[i] != TRANSPARENT_COLOR) {
        pdst[i] = TRANSPARENT_COLOR;
        modified = 1;
      }
    }
  }
  return modified;
}